

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamEnumerates.hpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
* TasDREAM::IO::getStringRuleMap_abi_cxx11_(void)

{
  long lVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
  *in_RDI;
  long *plVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>
  __l;
  allocator_type local_13a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_139;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_138;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  undefined4 local_28;
  
  local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"null","");
  local_138.second = dist_null;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"none","");
  local_f0 = 5;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"uniform","");
  local_c8 = 0;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"gaussian","");
  local_a0 = 1;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"exponential","");
  local_78 = 2;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"beta","");
  local_50 = 3;
  plVar2 = local_38;
  local_48[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"gamma","");
  local_28 = 4;
  __l._M_len = 7;
  __l._M_array = &local_138;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
  ::map(in_RDI,__l,&local_139,&local_13a);
  lVar1 = -0x118;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -5;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeDistribution> getStringRuleMap(){
        return std::initializer_list<std::pair<std::string const, TypeDistribution>>{
            {"null",        dist_null},
            {"none",        dist_none},
            {"uniform",     dist_uniform},
            {"gaussian",    dist_gaussian},
            {"exponential", dist_exponential},
            {"beta",        dist_beta},
            {"gamma",       dist_gamma}};
    }